

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CLI11.hpp
# Opt level: O1

bool __thiscall CLI::App::check_name(App *this,string *name_to_check)

{
  pointer pcVar1;
  int iVar2;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  _Var3;
  bool bVar4;
  string local_name;
  undefined1 local_f1;
  char *local_f0;
  long local_e8;
  char local_e0 [8];
  undefined8 uStack_d8;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_d0;
  long local_c8;
  char local_c0 [8];
  undefined8 uStack_b8;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_b0;
  long local_a8;
  char local_a0 [8];
  undefined8 uStack_98;
  char *local_90;
  long local_88;
  char local_80 [8];
  undefined8 uStack_78;
  char *local_70;
  long local_68;
  char local_60 [8];
  undefined8 uStack_58;
  undefined1 *local_50;
  size_t local_48;
  undefined1 local_40 [16];
  
  pcVar1 = (this->name_)._M_dataplus._M_p;
  local_50 = local_40;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)&local_50,pcVar1,pcVar1 + (this->name_)._M_string_length);
  if (this->ignore_underscore_ == true) {
    pcVar1 = (this->name_)._M_dataplus._M_p;
    local_b0._M_current = local_a0;
    ::std::__cxx11::string::_M_construct<char*>
              ((string *)&local_b0,pcVar1,pcVar1 + (this->name_)._M_string_length);
    local_f1 = 0x5f;
    _Var3 = ::std::
            __remove_if<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,__gnu_cxx::__ops::_Iter_equals_val<char_const>>
                      (local_b0,local_b0._M_current + local_a8,
                       (_Iter_equals_val<const_char>)&local_f1);
    local_e8 = (long)_Var3._M_current - (long)local_b0._M_current;
    *_Var3._M_current = '\0';
    if (local_b0._M_current == local_a0) {
      uStack_d8 = uStack_98;
      local_f0 = local_e0;
    }
    else {
      local_f0 = local_b0._M_current;
    }
    local_a8 = 0;
    local_a0[0] = '\0';
    local_b0._M_current = local_a0;
    ::std::__cxx11::string::operator=((string *)&local_50,(string *)&local_f0);
    if (local_f0 != local_e0) {
      operator_delete(local_f0);
    }
    if (local_b0._M_current != local_a0) {
      operator_delete(local_b0._M_current);
    }
    pcVar1 = (name_to_check->_M_dataplus)._M_p;
    local_d0._M_current = local_c0;
    ::std::__cxx11::string::_M_construct<char*>
              ((string *)&local_d0,pcVar1,pcVar1 + name_to_check->_M_string_length);
    local_f1 = 0x5f;
    _Var3 = ::std::
            __remove_if<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,__gnu_cxx::__ops::_Iter_equals_val<char_const>>
                      (local_d0,local_d0._M_current + local_c8,
                       (_Iter_equals_val<const_char>)&local_f1);
    local_e8 = (long)_Var3._M_current - (long)local_d0._M_current;
    *_Var3._M_current = '\0';
    if (local_d0._M_current == local_c0) {
      uStack_d8 = uStack_b8;
      local_f0 = local_e0;
    }
    else {
      local_f0 = local_d0._M_current;
    }
    local_c8 = 0;
    local_c0[0] = '\0';
    local_d0._M_current = local_c0;
    ::std::__cxx11::string::operator=((string *)name_to_check,(string *)&local_f0);
    if (local_f0 != local_e0) {
      operator_delete(local_f0);
    }
    if (local_d0._M_current != local_c0) {
      operator_delete(local_d0._M_current);
    }
  }
  if (this->ignore_case_ == true) {
    pcVar1 = (this->name_)._M_dataplus._M_p;
    local_70 = local_60;
    ::std::__cxx11::string::_M_construct<char*>
              ((string *)&local_70,pcVar1,pcVar1 + (this->name_)._M_string_length);
    ::std::
    transform<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,CLI::detail::to_lower(std::__cxx11::string)::_lambda(char_const&)_1_>
              (local_70,local_70 + local_68,local_70);
    if (local_70 == local_60) {
      uStack_d8 = uStack_58;
      local_f0 = local_e0;
    }
    else {
      local_f0 = local_70;
    }
    local_e8 = local_68;
    local_68 = 0;
    local_60[0] = '\0';
    local_70 = local_60;
    ::std::__cxx11::string::operator=((string *)&local_50,(string *)&local_f0);
    if (local_f0 != local_e0) {
      operator_delete(local_f0);
    }
    if (local_70 != local_60) {
      operator_delete(local_70);
    }
    pcVar1 = (name_to_check->_M_dataplus)._M_p;
    local_90 = local_80;
    ::std::__cxx11::string::_M_construct<char*>
              ((string *)&local_90,pcVar1,pcVar1 + name_to_check->_M_string_length);
    ::std::
    transform<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,CLI::detail::to_lower(std::__cxx11::string)::_lambda(char_const&)_1_>
              (local_90,local_90 + local_88,local_90);
    if (local_90 == local_80) {
      uStack_d8 = uStack_78;
      local_f0 = local_e0;
    }
    else {
      local_f0 = local_90;
    }
    local_e8 = local_88;
    local_88 = 0;
    local_80[0] = '\0';
    local_90 = local_80;
    ::std::__cxx11::string::operator=((string *)name_to_check,(string *)&local_f0);
    if (local_f0 != local_e0) {
      operator_delete(local_f0);
    }
    if (local_90 != local_80) {
      operator_delete(local_90);
    }
  }
  if (local_48 == name_to_check->_M_string_length) {
    if (local_48 == 0) {
      bVar4 = true;
    }
    else {
      iVar2 = bcmp(local_50,(name_to_check->_M_dataplus)._M_p,local_48);
      bVar4 = iVar2 == 0;
    }
  }
  else {
    bVar4 = false;
  }
  if (local_50 != local_40) {
    operator_delete(local_50);
  }
  return bVar4;
}

Assistant:

bool check_name(std::string name_to_check) const {
        std::string local_name = name_;
        if(ignore_underscore_) {
            local_name = detail::remove_underscore(name_);
            name_to_check = detail::remove_underscore(name_to_check);
        }
        if(ignore_case_) {
            local_name = detail::to_lower(name_);
            name_to_check = detail::to_lower(name_to_check);
        }

        return local_name == name_to_check;
    }